

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int m_split_fs(aec_stream_conflict *strm)

{
  int iVar1;
  internal_state_conflict *piVar2;
  byte *pbVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  
  piVar2 = strm->state;
  iVar1 = piVar2->id;
  do {
    if (piVar2->bitp < 1) {
      sVar7 = strm->avail_in;
      iVar5 = piVar2->bitp + -8;
      do {
        sVar7 = sVar7 - 1;
        if (sVar7 == 0xffffffffffffffff) {
          return 0;
        }
        strm->avail_in = sVar7;
        uVar8 = piVar2->acc << 8;
        piVar2->acc = uVar8;
        pbVar3 = strm->next_in;
        strm->next_in = pbVar3 + 1;
        piVar2->acc = *pbVar3 | uVar8;
        piVar2->bitp = iVar5 + 0x10;
        iVar5 = iVar5 + 8;
      } while (iVar5 < -7);
    }
    uVar8 = piVar2->acc;
    uVar4 = uVar8 >> ((ulong)(byte)((char)piVar2->bitp - 1) & 0x3f);
    iVar5 = piVar2->bitp;
    while ((uVar4 & 1) == 0) {
      if (iVar5 == 1) {
        if (strm->avail_in == 0) {
          return 0;
        }
        strm->avail_in = strm->avail_in - 1;
        piVar2->acc = uVar8 << 8;
        pbVar3 = strm->next_in;
        strm->next_in = pbVar3 + 1;
        uVar8 = uVar8 << 8 | (ulong)*pbVar3;
        piVar2->acc = uVar8;
        piVar2->bitp = 9;
        iVar5 = 9;
      }
      piVar2->fs = piVar2->fs + 1;
      piVar2->bitp = iVar5 + -1;
      uVar4 = uVar8 >> ((ulong)(byte)((char)iVar5 - 2) & 0x3f);
      iVar5 = iVar5 + -1;
    }
    piVar2->rsip[piVar2->sample_counter] = piVar2->fs << ((char)iVar1 - 1U & 0x1f);
    piVar2->fs = 0;
    piVar2->bitp = piVar2->bitp + -1;
    uVar6 = piVar2->sample_counter + 1;
    piVar2->sample_counter = uVar6;
  } while (uVar6 < piVar2->encoded_block_size);
  piVar2->sample_counter = 0;
  piVar2->mode = m_split_output;
  return 1;
}

Assistant:

static int m_split_fs(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    int k = state->id - 1;

    do {
        if (fs_ask(strm) == 0)
            return M_EXIT;
        state->rsip[state->sample_counter] = state->fs << k;
        fs_drop(strm);
    } while(++state->sample_counter < state->encoded_block_size);

    state->sample_counter = 0;
    state->mode = m_split_output;

    return M_CONTINUE;
}